

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

string * __thiscall
google::protobuf::DescriptorPool::Tables::AllocateString(Tables *this,string *value)

{
  pointer *pppbVar1;
  pointer pcVar2;
  iterator __position;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  string *result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  (pbVar3->_M_dataplus)._M_p = (pointer)&pbVar3->field_2;
  pcVar2 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)pbVar3,pcVar2,pcVar2 + value->_M_string_length);
  __position._M_current =
       (this->strings_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_20 = pbVar3;
  if (__position._M_current ==
      (this->strings_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<std::__cxx11::string*,std::allocator<std::__cxx11::string*>>::
    _M_realloc_insert<std::__cxx11::string*const&>
              ((vector<std::__cxx11::string*,std::allocator<std::__cxx11::string*>> *)
               &this->strings_,__position,&local_20);
  }
  else {
    *__position._M_current = pbVar3;
    pppbVar1 = &(this->strings_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppbVar1 = *pppbVar1 + 1;
  }
  return local_20;
}

Assistant:

string* DescriptorPool::Tables::AllocateString(const string& value) {
  string* result = new string(value);
  strings_.push_back(result);
  return result;
}